

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int update_arg(void *field,char **orig_field,uint *field_given,uint *prev_given,char *value,
              char **possible_values,char *default_value,cmdline_parser_arg_type arg_type,
              int check_ambiguity,int override,int no_free,int multiple_option,char *long_opt,
              char short_opt,char *additional_error)

{
  char *pcVar1;
  int *in_RCX;
  int *in_RDX;
  long *in_RSI;
  double *in_RDI;
  char *in_R8;
  undefined8 *in_R9;
  double dVar2;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined8 in_stack_00000038;
  char in_stack_00000040;
  char *in_stack_00000048;
  char **string_field;
  int found;
  char *val;
  char *stop_char;
  undefined4 in_stack_ffffffffffffff58;
  int iVar3;
  char *local_a0;
  char *local_80;
  char *local_48;
  char *local_40 [2];
  char *local_30;
  long *local_18;
  double *local_10;
  int local_4;
  
  local_40[0] = (char *)0x0;
  if (((in_stack_00000030 == 0) && (in_RCX != (int *)0x0)) &&
     ((*in_RCX != 0 || ((in_stack_00000018 != 0 && (*in_RDX != 0)))))) {
    if (in_stack_00000040 == '-') {
      if (in_stack_00000048 == (char *)0x0) {
        local_a0 = "";
      }
      else {
        local_a0 = in_stack_00000048;
      }
      fprintf(_stderr,"%s: `--%s\' option given more than once%s\n",package_name,in_stack_00000038,
              local_a0);
    }
    else {
      if (in_stack_00000048 == (char *)0x0) {
        local_80 = "";
      }
      else {
        local_80 = in_stack_00000048;
      }
      fprintf(_stderr,"%s: `--%s\' (`-%c\') option given more than once%s\n",package_name,
              in_stack_00000038,(ulong)(uint)(int)in_stack_00000040,local_80);
    }
    local_4 = 1;
  }
  else if ((in_RDX == (int *)0x0) || ((*in_RDX == 0 || (in_stack_00000020 != 0)))) {
    if (in_RCX != (int *)0x0) {
      *in_RCX = *in_RCX + 1;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = *in_RDX + 1;
    }
    local_48 = in_R8;
    if (in_R9 != (undefined8 *)0x0) {
      local_48 = (char *)*in_R9;
    }
    iVar3 = in_stack_00000010;
    local_30 = in_R8;
    local_18 = in_RSI;
    if (in_stack_00000010 == 1) {
      if (local_48 != (char *)0x0) {
        if ((in_stack_00000028 == 0) && (*in_RDI != 0.0)) {
          free((void *)*in_RDI);
        }
        pcVar1 = gengetopt_strdup((char *)CONCAT44(iVar3,in_stack_ffffffffffffff58));
        *in_RDI = (double)pcVar1;
      }
    }
    else if ((in_stack_00000010 == 2) && (local_48 != (char *)0x0)) {
      local_10 = in_RDI;
      dVar2 = strtod(local_48,local_40);
      *local_10 = dVar2;
    }
    if (((in_stack_00000010 == 2) && (local_48 != (char *)0x0)) &&
       ((local_40[0] == (char *)0x0 || (*local_40[0] != '\0')))) {
      fprintf(_stderr,"%s: invalid numeric value: %s\n",package_name,local_48);
      local_4 = 1;
    }
    else {
      if (((in_stack_00000010 != 0) && (local_30 != (char *)0x0)) && (local_18 != (long *)0x0)) {
        if (in_stack_00000028 == 0) {
          if (*local_18 != 0) {
            free((void *)*local_18);
          }
          pcVar1 = gengetopt_strdup((char *)CONCAT44(iVar3,in_stack_ffffffffffffff58));
          *local_18 = (long)pcVar1;
        }
        else {
          *local_18 = (long)local_30;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
int update_arg(void *field, char **orig_field,
               unsigned int *field_given, unsigned int *prev_given, 
               char *value, const char *possible_values[],
               const char *default_value,
               cmdline_parser_arg_type arg_type,
               int check_ambiguity, int override,
               int no_free, int multiple_option,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  char *stop_char = 0;
  const char *val = value;
  int found;
  char **string_field;
  FIX_UNUSED (field);

  stop_char = 0;
  found = 0;

  if (!multiple_option && prev_given && (*prev_given || (check_ambiguity && *field_given)))
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: `--%s' (`-%c') option given more than once%s\n", 
               package_name, long_opt, short_opt,
               (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: `--%s' option given more than once%s\n", 
               package_name, long_opt,
               (additional_error ? additional_error : ""));
      return 1; /* failure */
    }

  FIX_UNUSED (default_value);
    
  if (field_given && *field_given && ! override)
    return 0;
  if (prev_given)
    (*prev_given)++;
  if (field_given)
    (*field_given)++;
  if (possible_values)
    val = possible_values[found];

  switch(arg_type) {
  case ARG_DOUBLE:
    if (val) *((double *)field) = strtod (val, &stop_char);
    break;
  case ARG_STRING:
    if (val) {
      string_field = (char **)field;
      if (!no_free && *string_field)
        free (*string_field); /* free previous string */
      *string_field = gengetopt_strdup (val);
    }
    break;
  default:
    break;
  };

  /* check numeric conversion */
  switch(arg_type) {
  case ARG_DOUBLE:
    if (val && !(stop_char && *stop_char == '\0')) {
      fprintf(stderr, "%s: invalid numeric value: %s\n", package_name, val);
      return 1; /* failure */
    }
    break;
  default:
    ;
  };

  /* store the original value */
  switch(arg_type) {
  case ARG_NO:
    break;
  default:
    if (value && orig_field) {
      if (no_free) {
        *orig_field = value;
      } else {
        if (*orig_field)
          free (*orig_field); /* free previous string */
        *orig_field = gengetopt_strdup (value);
      }
    }
  };

  return 0; /* OK */
}